

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O1

void __thiscall FHealthBar::MakeTexture(FHealthBar *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint i;
  long lVar5;
  uint i_1;
  ulong uVar6;
  uint i_4;
  ulong uVar7;
  
  uVar3 = this->VialLevel;
  uVar7 = (ulong)uVar3;
  if (uVar7 == 999) {
    bVar1 = this->Colors[4];
    bVar2 = this->Colors[5];
    lVar5 = 0;
    do {
      *(uint *)(this->Pixels + lVar5 * 4) =
           (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)bVar2 << 0x18 | (uint)bVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 100);
  }
  else if ((int)uVar3 < 0x65) {
    if ((int)uVar3 < 0xb) {
      if (0 < (int)uVar3) {
        bVar1 = this->Colors[7];
        bVar2 = this->Colors[6];
        uVar6 = 0;
        do {
          *(uint *)(this->Pixels + uVar6 * 4) =
               (uint)bVar2 << 0x10 | (uint)bVar1 << 8 | (uint)bVar1 << 0x18 | (uint)bVar2;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
    }
    else if ((int)uVar3 < 0x15) {
      bVar1 = this->Colors[5];
      bVar2 = this->Colors[4];
      uVar6 = 0;
      do {
        *(uint *)(this->Pixels + uVar6 * 4) =
             (uint)bVar2 << 0x10 | (uint)bVar1 << 8 | (uint)bVar1 << 0x18 | (uint)bVar2;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    else {
      bVar1 = this->Colors[0];
      bVar2 = this->Colors[1];
      uVar6 = 0;
      do {
        *(uint *)(this->Pixels + uVar6 * 4) =
             (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)bVar2 << 0x18 | (uint)bVar1;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    iVar4 = this->VialLevel;
    if ((long)iVar4 < 100) {
      memset(this->Pixels + (long)iVar4 * 4,0,(ulong)(100 - iVar4) << 2);
      return;
    }
  }
  else {
    if ((int)uVar3 < 200) {
      bVar1 = this->Colors[1];
      bVar2 = this->Colors[0];
      uVar7 = 0;
      do {
        *(uint *)(this->Pixels + uVar7 * 4) =
             (uint)bVar2 << 0x10 | (uint)bVar1 << 8 | (uint)bVar1 << 0x18 | (uint)bVar2;
        uVar7 = uVar7 + 1;
      } while ((200U - (long)(int)uVar3 & 0xffffffff) != uVar7);
    }
    bVar1 = this->Colors[3];
    bVar2 = this->Colors[2];
    uVar7 = 0;
    do {
      *(uint *)((long)this + uVar7 * 4 + (200U - (long)(int)uVar3) * 4 + 0x98) =
           (uint)bVar2 << 0x10 | (uint)bVar1 << 8 | (uint)bVar1 << 0x18 | (uint)bVar2;
      uVar7 = uVar7 + 1;
    } while (uVar3 - 100 != uVar7);
  }
  return;
}

Assistant:

void FHealthBar::MakeTexture ()
{
	if (VialLevel == 999)
	{
		FillBar (0, 100, Colors[4], Colors[5]);
	}
	else
	{
		if (VialLevel <= 100)
		{
			if (VialLevel <= 10)
			{
				FillBar (0, VialLevel, Colors[6], Colors[7]);
			}
			else if (VialLevel <= 20)
			{
				FillBar (0, VialLevel, Colors[4], Colors[5]);
			}
			else
			{
				FillBar (0, VialLevel, Colors[0], Colors[1]);
			}
			FillBar (VialLevel, 100, 0, 0);
		}
		else
		{
			int stop = 100 - (VialLevel - 100);
			FillBar (0, stop, Colors[0], Colors[1]);
			FillBar (stop, 100, Colors[2], Colors[3]);
		}
	}
}